

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commandlineflags.cc
# Opt level: O0

bool benchmark::ParseInt32Flag(char *str,char *flag,int32_t *value)

{
  bool in_stack_0000001f;
  char *in_stack_00000020;
  char *in_stack_00000028;
  char *value_str;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  int32_t *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  string local_48 [32];
  char *local_28;
  byte local_1;
  
  local_28 = ParseFlagValue(in_stack_00000028,in_stack_00000020,in_stack_0000001f);
  if (local_28 == (char *)0x0) {
    local_1 = 0;
  }
  else {
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &stack0xffffffffffffff97;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff98,"The value of flag --",(allocator *)__lhs);
    std::operator+(__lhs,(char *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
    local_1 = ParseInt32(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                         in_stack_ffffffffffffff88);
    std::__cxx11::string::~string(local_48);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff97);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool ParseInt32Flag(const char* str, const char* flag, int32_t* value) {
  // Gets the value of the flag as a string.
  const char* const value_str = ParseFlagValue(str, flag, false);

  // Aborts if the parsing failed.
  if (value_str == nullptr) return false;

  // Sets *value to the value of the flag.
  return ParseInt32(std::string("The value of flag --") + flag, value_str,
                    value);
}